

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_16x16_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  int32_t *piVar2;
  byte bVar3;
  code *pcVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined8 uVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  int8_t *piVar19;
  bool bVar20;
  int16_t *piVar21;
  uint uVar22;
  undefined7 in_register_00000009;
  long lVar23;
  bool bVar24;
  long lVar25;
  ulong uVar26;
  undefined8 *puVar27;
  undefined4 uVar28;
  undefined1 auVar30 [12];
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  undefined4 uVar35;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar37 [12];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined4 uVar61;
  undefined1 auVar63 [12];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined4 uVar78;
  undefined1 auVar80 [12];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  __m128i buf0 [16];
  __m128i buf1 [32];
  int16_t *local_348;
  code *local_340;
  undefined8 local_338 [2];
  undefined2 local_328;
  undefined2 uStack_326;
  undefined2 uStack_324;
  undefined2 uStack_322;
  undefined2 uStack_320;
  undefined2 uStack_31e;
  undefined2 uStack_31c;
  undefined2 uStack_31a;
  undefined1 local_318 [16];
  undefined2 local_308;
  undefined2 uStack_306;
  undefined2 uStack_304;
  undefined2 uStack_302;
  undefined2 uStack_300;
  undefined2 uStack_2fe;
  undefined2 uStack_2fc;
  undefined2 uStack_2fa;
  undefined1 local_2f8 [16];
  undefined2 local_2e8;
  undefined2 uStack_2e6;
  undefined2 uStack_2e4;
  undefined2 uStack_2e2;
  undefined2 uStack_2e0;
  undefined2 uStack_2de;
  undefined2 uStack_2dc;
  undefined2 uStack_2da;
  undefined1 local_2d8 [16];
  undefined2 local_2c8;
  undefined2 uStack_2c6;
  undefined2 uStack_2c4;
  undefined2 uStack_2c2;
  undefined2 uStack_2c0;
  undefined2 uStack_2be;
  undefined2 uStack_2bc;
  undefined2 uStack_2ba;
  undefined1 local_2b8 [16];
  undefined2 local_2a8;
  undefined2 uStack_2a6;
  undefined2 uStack_2a4;
  undefined2 uStack_2a2;
  undefined2 uStack_2a0;
  undefined2 uStack_29e;
  undefined2 uStack_29c;
  undefined2 uStack_29a;
  undefined1 local_298 [16];
  undefined2 local_288;
  undefined2 uStack_286;
  undefined2 uStack_284;
  undefined2 uStack_282;
  undefined2 uStack_280;
  undefined2 uStack_27e;
  undefined2 uStack_27c;
  undefined2 uStack_27a;
  undefined1 local_278 [16];
  undefined2 local_268;
  undefined2 uStack_266;
  undefined2 uStack_264;
  undefined2 uStack_262;
  undefined2 uStack_260;
  undefined2 uStack_25e;
  undefined2 uStack_25c;
  undefined2 uStack_25a;
  undefined1 local_258 [16];
  undefined2 local_248;
  undefined2 uStack_246;
  undefined2 uStack_244;
  undefined2 uStack_242;
  undefined2 uStack_240;
  undefined2 uStack_23e;
  undefined2 uStack_23c;
  undefined2 uStack_23a;
  undefined8 local_238 [4];
  undefined8 uStack_218;
  undefined4 auStack_210 [6];
  undefined8 uStack_1f8;
  undefined8 auStack_1f0 [3];
  undefined8 uStack_1d8;
  undefined4 auStack_1d0 [38];
  undefined8 local_138 [4];
  undefined8 uStack_118;
  undefined4 auStack_110 [6];
  undefined8 uStack_f8;
  undefined8 auStack_f0 [3];
  undefined8 uStack_d8;
  undefined4 auStack_d0 [40];
  undefined1 auVar29 [12];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar36 [12];
  undefined1 auVar42 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [12];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar79 [12];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  
  piVar19 = av1_fwd_txfm_shift_ls[2];
  uVar26 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar4 = *(code **)((long)col_txfm8x16_arr + uVar26);
  local_340 = *(code **)((long)row_txfm8x16_arr + uVar26);
  lVar25 = 0;
  bVar20 = true;
  local_348 = input;
  do {
    bVar24 = bVar20;
    piVar21 = local_348 + lVar25 * 8;
    if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      lVar23 = 0x100;
      do {
        uVar9 = *(undefined8 *)(piVar21 + 4);
        *(undefined8 *)((long)&local_348 + lVar23) = *(undefined8 *)piVar21;
        *(undefined8 *)((long)&local_340 + lVar23) = uVar9;
        piVar21 = piVar21 + stride;
        lVar23 = lVar23 + -0x10;
      } while (lVar23 != 0);
    }
    else {
      lVar23 = 0;
      do {
        uVar9 = *(undefined8 *)(piVar21 + 4);
        *(undefined8 *)((long)local_338 + lVar23) = *(undefined8 *)piVar21;
        *(undefined8 *)((long)local_338 + lVar23 + 8) = uVar9;
        lVar23 = lVar23 + 0x10;
        piVar21 = piVar21 + stride;
      } while (lVar23 != 0x100);
    }
    bVar3 = *piVar19;
    uVar22 = (uint)(char)bVar3;
    if ((int)uVar22 < 0) {
      auVar31 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
      auVar31 = pshuflw(auVar31,auVar31,0);
      auVar31._4_4_ = auVar31._0_4_;
      auVar31._8_4_ = auVar31._0_4_;
      auVar31._12_4_ = auVar31._0_4_;
      lVar23 = 0;
      do {
        auVar44 = paddsw(*(undefined1 (*) [16])((long)local_338 + lVar23),auVar31);
        auVar44 = psraw(auVar44,ZEXT416(-uVar22));
        *(undefined1 (*) [16])((long)local_338 + lVar23) = auVar44;
        lVar23 = lVar23 + 0x10;
      } while (lVar23 != 0x100);
    }
    else if (bVar3 != 0) {
      lVar23 = 0;
      do {
        auVar31 = psllw(*(undefined1 (*) [16])((long)local_338 + lVar23),ZEXT416(uVar22));
        *(undefined1 (*) [16])((long)local_338 + lVar23) = auVar31;
        lVar23 = lVar23 + 0x10;
      } while (lVar23 != 0x100);
    }
    (*pcVar4)(local_338,local_338,0xd);
    bVar3 = piVar19[1];
    uVar22 = (uint)(char)bVar3;
    if ((int)uVar22 < 0) {
      auVar31 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
      auVar31 = pshuflw(auVar31,auVar31,0);
      auVar44._0_4_ = auVar31._0_4_;
      auVar44._4_4_ = auVar44._0_4_;
      auVar44._8_4_ = auVar44._0_4_;
      auVar44._12_4_ = auVar44._0_4_;
      lVar23 = 0;
      do {
        auVar31 = paddsw(*(undefined1 (*) [16])((long)local_338 + lVar23),auVar44);
        auVar31 = psraw(auVar31,ZEXT416(-uVar22));
        *(undefined1 (*) [16])((long)local_338 + lVar23) = auVar31;
        lVar23 = lVar23 + 0x10;
      } while (lVar23 != 0x100);
    }
    else if (bVar3 != 0) {
      lVar23 = 0;
      do {
        auVar31 = psllw(*(undefined1 (*) [16])((long)local_338 + lVar23),ZEXT416(uVar22));
        *(undefined1 (*) [16])((long)local_338 + lVar23) = auVar31;
        lVar23 = lVar23 + 0x10;
      } while (lVar23 != 0x100);
    }
    auVar48._0_12_ = local_338._0_12_;
    auVar48._12_2_ = local_338[0]._6_2_;
    auVar48._14_2_ = uStack_322;
    auVar47._12_4_ = auVar48._12_4_;
    auVar47._0_10_ = local_338._0_10_;
    auVar47._10_2_ = uStack_324;
    auVar46._10_6_ = auVar47._10_6_;
    auVar46._0_8_ = local_338[0];
    auVar46._8_2_ = local_338[0]._4_2_;
    auVar10._4_8_ = auVar46._8_8_;
    auVar10._2_2_ = uStack_326;
    auVar10._0_2_ = local_338[0]._2_2_;
    auVar45._0_4_ = CONCAT22(local_328,(short)local_338[0]);
    auVar45._4_12_ = auVar10;
    auVar72._0_12_ = local_318._0_12_;
    auVar72._12_2_ = local_318._6_2_;
    auVar72._14_2_ = uStack_302;
    auVar71._12_4_ = auVar72._12_4_;
    auVar71._0_10_ = local_318._0_10_;
    auVar71._10_2_ = uStack_304;
    auVar70._10_6_ = auVar71._10_6_;
    auVar70._0_8_ = local_318._0_8_;
    auVar70._8_2_ = local_318._4_2_;
    auVar11._4_8_ = auVar70._8_8_;
    auVar11._2_2_ = uStack_306;
    auVar11._0_2_ = local_318._2_2_;
    auVar56._0_12_ = local_2f8._0_12_;
    auVar56._12_2_ = local_2f8._6_2_;
    auVar56._14_2_ = uStack_2e2;
    auVar55._12_4_ = auVar56._12_4_;
    auVar55._0_10_ = local_2f8._0_10_;
    auVar55._10_2_ = uStack_2e4;
    auVar54._10_6_ = auVar55._10_6_;
    auVar54._0_8_ = local_2f8._0_8_;
    auVar54._8_2_ = local_2f8._4_2_;
    auVar12._4_8_ = auVar54._8_8_;
    auVar12._2_2_ = uStack_2e6;
    auVar12._0_2_ = local_2f8._2_2_;
    auVar53._0_4_ = CONCAT22(local_2e8,local_2f8._0_2_);
    auVar53._4_12_ = auVar12;
    auVar87._0_12_ = local_2d8._0_12_;
    auVar87._12_2_ = local_2d8._6_2_;
    auVar87._14_2_ = uStack_2c2;
    auVar86._12_4_ = auVar87._12_4_;
    auVar86._0_10_ = local_2d8._0_10_;
    auVar86._10_2_ = uStack_2c4;
    auVar85._10_6_ = auVar86._10_6_;
    auVar85._0_8_ = local_2d8._0_8_;
    auVar85._8_2_ = local_2d8._4_2_;
    auVar13._4_8_ = auVar85._8_8_;
    auVar13._2_2_ = uStack_2c6;
    auVar13._0_2_ = local_2d8._2_2_;
    uVar28 = CONCAT22(uStack_320,(short)local_338[1]);
    auVar29._0_8_ = CONCAT26(uStack_31e,CONCAT24(local_338[1]._2_2_,uVar28));
    auVar29._8_2_ = local_338[1]._4_2_;
    auVar29._10_2_ = uStack_31c;
    auVar32._12_2_ = local_338[1]._6_2_;
    auVar32._0_12_ = auVar29;
    auVar32._14_2_ = uStack_31a;
    uVar61 = CONCAT22(uStack_300,local_318._8_2_);
    auVar62._0_8_ = CONCAT26(uStack_2fe,CONCAT24(local_318._10_2_,uVar61));
    auVar62._8_2_ = local_318._12_2_;
    auVar62._10_2_ = uStack_2fc;
    auVar64._12_2_ = local_318._14_2_;
    auVar64._0_12_ = auVar62;
    auVar64._14_2_ = uStack_2fa;
    uVar35 = CONCAT22(uStack_2e0,local_2f8._8_2_);
    auVar36._0_8_ = CONCAT26(uStack_2de,CONCAT24(local_2f8._10_2_,uVar35));
    auVar36._8_2_ = local_2f8._12_2_;
    auVar36._10_2_ = uStack_2dc;
    auVar38._12_2_ = local_2f8._14_2_;
    auVar38._0_12_ = auVar36;
    auVar38._14_2_ = uStack_2da;
    uVar78 = CONCAT22(uStack_2c0,local_2d8._8_2_);
    auVar79._0_8_ = CONCAT26(uStack_2be,CONCAT24(local_2d8._10_2_,uVar78));
    auVar79._8_2_ = local_2d8._12_2_;
    auVar79._10_2_ = uStack_2bc;
    auVar81._12_2_ = local_2d8._14_2_;
    auVar81._0_12_ = auVar79;
    auVar81._14_2_ = uStack_2ba;
    auVar66._0_8_ = auVar45._0_8_;
    auVar66._8_4_ = auVar10._0_4_;
    auVar66._12_4_ = auVar11._0_4_;
    auVar68._0_8_ = auVar53._0_8_;
    auVar68._8_4_ = auVar12._0_4_;
    auVar68._12_4_ = auVar13._0_4_;
    auVar76._8_4_ = (int)((ulong)auVar29._0_8_ >> 0x20);
    auVar76._0_8_ = auVar29._0_8_;
    auVar76._12_4_ = (int)((ulong)auVar62._0_8_ >> 0x20);
    auVar83._8_4_ = (int)((ulong)auVar36._0_8_ >> 0x20);
    auVar83._0_8_ = auVar36._0_8_;
    auVar83._12_4_ = (int)((ulong)auVar79._0_8_ >> 0x20);
    local_238[lVar25 * 0x10] = CONCAT44(CONCAT22(local_308,local_318._0_2_),auVar45._0_4_);
    local_238[lVar25 * 0x10 + 1] = CONCAT44(CONCAT22(local_2c8,local_2d8._0_2_),auVar53._0_4_);
    local_238[lVar25 * 0x10 + 2] = auVar66._8_8_;
    (&uStack_218)[lVar25 * 0x10 + -1] = auVar68._8_8_;
    *(int *)(&uStack_218 + lVar25 * 0x10) = auVar46._8_4_;
    *(int *)((long)&uStack_218 + (lVar25 * 0x20 + 1) * 4) = auVar70._8_4_;
    *(int *)(&uStack_218 + lVar25 * 0x10 + 1) = auVar54._8_4_;
    *(int *)((long)&uStack_218 + (lVar25 * 0x20 + 3) * 4) = auVar85._8_4_;
    *(undefined4 *)(&uStack_218 + lVar25 * 0x10 + 3) = auVar47._12_4_;
    *(undefined4 *)((long)&uStack_218 + (lVar25 * 0x20 + 7) * 4) = auVar71._12_4_;
    *(undefined4 *)(&uStack_1f8 + lVar25 * 0x10) = auVar55._12_4_;
    *(undefined4 *)((long)&uStack_1f8 + lVar25 * 0x80 + 4) = auVar86._12_4_;
    (&uStack_1f8)[lVar25 * 0x10] = CONCAT44(uVar61,uVar28);
    auStack_1f0[lVar25 * 0x10] = CONCAT44(uVar78,uVar35);
    auStack_1f0[lVar25 * 0x10 + 1] = auVar76._8_8_;
    (&uStack_1d8)[lVar25 * 0x10 + -1] = auVar83._8_8_;
    *(int *)(&uStack_1d8 + lVar25 * 0x10) = auVar29._8_4_;
    *(int *)((long)&uStack_1d8 + (lVar25 * 0x20 + 1) * 4) = auVar62._8_4_;
    *(int *)(&uStack_1d8 + lVar25 * 0x10 + 1) = auVar36._8_4_;
    *(int *)((long)&uStack_1d8 + (lVar25 * 0x20 + 3) * 4) = auVar79._8_4_;
    *(int *)(&uStack_1d8 + lVar25 * 0x10 + 3) = auVar32._12_4_;
    *(int *)((long)&uStack_1d8 + (lVar25 * 0x20 + 7) * 4) = auVar64._12_4_;
    *(int *)(&uStack_1d8 + lVar25 * 0x10 + 4) = auVar38._12_4_;
    *(int *)((long)&uStack_1d8 + (lVar25 * 0x20 + 9) * 4) = auVar81._12_4_;
    auVar52._0_12_ = local_2b8._0_12_;
    auVar52._12_2_ = local_2b8._6_2_;
    auVar52._14_2_ = uStack_2a2;
    auVar51._12_4_ = auVar52._12_4_;
    auVar51._0_10_ = local_2b8._0_10_;
    auVar51._10_2_ = uStack_2a4;
    auVar50._10_6_ = auVar51._10_6_;
    auVar50._0_8_ = local_2b8._0_8_;
    auVar50._8_2_ = local_2b8._4_2_;
    auVar14._4_8_ = auVar50._8_8_;
    auVar14._2_2_ = uStack_2a6;
    auVar14._0_2_ = local_2b8._2_2_;
    auVar49._0_4_ = CONCAT22(local_2a8,local_2b8._0_2_);
    auVar49._4_12_ = auVar14;
    auVar75._0_12_ = local_298._0_12_;
    auVar75._12_2_ = local_298._6_2_;
    auVar75._14_2_ = uStack_282;
    auVar74._12_4_ = auVar75._12_4_;
    auVar74._0_10_ = local_298._0_10_;
    auVar74._10_2_ = uStack_284;
    auVar73._10_6_ = auVar74._10_6_;
    auVar73._0_8_ = local_298._0_8_;
    auVar73._8_2_ = local_298._4_2_;
    auVar15._4_8_ = auVar73._8_8_;
    auVar15._2_2_ = uStack_286;
    auVar15._0_2_ = local_298._2_2_;
    auVar60._0_12_ = local_278._0_12_;
    auVar60._12_2_ = local_278._6_2_;
    auVar60._14_2_ = uStack_262;
    auVar59._12_4_ = auVar60._12_4_;
    auVar59._0_10_ = local_278._0_10_;
    auVar59._10_2_ = uStack_264;
    auVar58._10_6_ = auVar59._10_6_;
    auVar58._0_8_ = local_278._0_8_;
    auVar58._8_2_ = local_278._4_2_;
    auVar16._4_8_ = auVar58._8_8_;
    auVar16._2_2_ = uStack_266;
    auVar16._0_2_ = local_278._2_2_;
    auVar57._0_4_ = CONCAT22(local_268,local_278._0_2_);
    auVar57._4_12_ = auVar16;
    auVar90._0_12_ = local_258._0_12_;
    auVar90._12_2_ = local_258._6_2_;
    auVar90._14_2_ = uStack_242;
    auVar89._12_4_ = auVar90._12_4_;
    auVar89._0_10_ = local_258._0_10_;
    auVar89._10_2_ = uStack_244;
    auVar88._10_6_ = auVar89._10_6_;
    auVar88._0_8_ = local_258._0_8_;
    auVar88._8_2_ = local_258._4_2_;
    auVar17._4_8_ = auVar88._8_8_;
    auVar17._2_2_ = uStack_246;
    auVar17._0_2_ = local_258._2_2_;
    uVar28 = CONCAT22(uStack_2a0,local_2b8._8_2_);
    auVar30._0_8_ = CONCAT26(uStack_29e,CONCAT24(local_2b8._10_2_,uVar28));
    auVar30._8_2_ = local_2b8._12_2_;
    auVar30._10_2_ = uStack_29c;
    auVar33._12_2_ = local_2b8._14_2_;
    auVar33._0_12_ = auVar30;
    auVar33._14_2_ = uStack_29a;
    uVar61 = CONCAT22(uStack_280,local_298._8_2_);
    auVar63._0_8_ = CONCAT26(uStack_27e,CONCAT24(local_298._10_2_,uVar61));
    auVar63._8_2_ = local_298._12_2_;
    auVar63._10_2_ = uStack_27c;
    auVar65._12_2_ = local_298._14_2_;
    auVar65._0_12_ = auVar63;
    auVar65._14_2_ = uStack_27a;
    uVar35 = CONCAT22(uStack_260,local_278._8_2_);
    auVar37._0_8_ = CONCAT26(uStack_25e,CONCAT24(local_278._10_2_,uVar35));
    auVar37._8_2_ = local_278._12_2_;
    auVar37._10_2_ = uStack_25c;
    auVar39._12_2_ = local_278._14_2_;
    auVar39._0_12_ = auVar37;
    auVar39._14_2_ = uStack_25a;
    uVar78 = CONCAT22(uStack_240,local_258._8_2_);
    auVar80._0_8_ = CONCAT26(uStack_23e,CONCAT24(local_258._10_2_,uVar78));
    auVar80._8_2_ = local_258._12_2_;
    auVar80._10_2_ = uStack_23c;
    auVar82._12_2_ = local_258._14_2_;
    auVar82._0_12_ = auVar80;
    auVar82._14_2_ = uStack_23a;
    auVar67._0_8_ = auVar49._0_8_;
    auVar67._8_4_ = auVar14._0_4_;
    auVar67._12_4_ = auVar15._0_4_;
    auVar69._0_8_ = auVar57._0_8_;
    auVar69._8_4_ = auVar16._0_4_;
    auVar69._12_4_ = auVar17._0_4_;
    auVar77._8_4_ = (int)((ulong)auVar30._0_8_ >> 0x20);
    auVar77._0_8_ = auVar30._0_8_;
    auVar77._12_4_ = (int)((ulong)auVar63._0_8_ >> 0x20);
    auVar84._8_4_ = (int)((ulong)auVar37._0_8_ >> 0x20);
    auVar84._0_8_ = auVar37._0_8_;
    auVar84._12_4_ = (int)((ulong)auVar80._0_8_ >> 0x20);
    local_138[lVar25 * 0x10] = CONCAT44(CONCAT22(local_288,local_298._0_2_),auVar49._0_4_);
    local_138[lVar25 * 0x10 + 1] = CONCAT44(CONCAT22(local_248,local_258._0_2_),auVar57._0_4_);
    local_138[lVar25 * 0x10 + 2] = auVar67._8_8_;
    (&uStack_118)[lVar25 * 0x10 + -1] = auVar69._8_8_;
    *(int *)(&uStack_118 + lVar25 * 0x10) = auVar50._8_4_;
    *(int *)((long)&uStack_118 + (lVar25 * 0x20 + 1) * 4) = auVar73._8_4_;
    *(int *)(&uStack_118 + lVar25 * 0x10 + 1) = auVar58._8_4_;
    *(int *)((long)&uStack_118 + (lVar25 * 0x20 + 3) * 4) = auVar88._8_4_;
    *(undefined4 *)(&uStack_118 + lVar25 * 0x10 + 3) = auVar51._12_4_;
    *(undefined4 *)((long)&uStack_118 + (lVar25 * 0x20 + 7) * 4) = auVar74._12_4_;
    *(undefined4 *)(&uStack_f8 + lVar25 * 0x10) = auVar59._12_4_;
    *(undefined4 *)((long)&uStack_f8 + lVar25 * 0x80 + 4) = auVar89._12_4_;
    (&uStack_f8)[lVar25 * 0x10] = CONCAT44(uVar61,uVar28);
    auStack_f0[lVar25 * 0x10] = CONCAT44(uVar78,uVar35);
    auStack_f0[lVar25 * 0x10 + 1] = auVar77._8_8_;
    (&uStack_d8)[lVar25 * 0x10 + -1] = auVar84._8_8_;
    *(int *)(&uStack_d8 + lVar25 * 0x10) = auVar30._8_4_;
    *(int *)((long)&uStack_d8 + (lVar25 * 0x20 + 1) * 4) = auVar63._8_4_;
    *(int *)(&uStack_d8 + lVar25 * 0x10 + 1) = auVar37._8_4_;
    *(int *)((long)&uStack_d8 + (lVar25 * 0x20 + 3) * 4) = auVar80._8_4_;
    *(int *)(&uStack_d8 + lVar25 * 0x10 + 3) = auVar33._12_4_;
    *(int *)((long)&uStack_d8 + (lVar25 * 0x20 + 7) * 4) = auVar65._12_4_;
    *(int *)(&uStack_d8 + lVar25 * 0x10 + 4) = auVar39._12_4_;
    *(int *)((long)&uStack_d8 + (lVar25 * 0x20 + 9) * 4) = auVar82._12_4_;
    lVar25 = 1;
    bVar20 = false;
  } while (bVar24);
  lVar25 = 0;
  bVar20 = true;
  do {
    bVar24 = bVar20;
    puVar27 = local_238 + lVar25 * 0x20;
    if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      lVar23 = 0x100;
      do {
        uVar9 = puVar27[1];
        *(undefined8 *)((long)&local_348 + lVar23) = *puVar27;
        *(undefined8 *)((long)&local_340 + lVar23) = uVar9;
        puVar27 = puVar27 + 2;
        lVar23 = lVar23 + -0x10;
      } while (lVar23 != 0);
      puVar27 = local_338;
    }
    (*local_340)(puVar27,puVar27,0xc);
    auVar40._8_8_ = extraout_XMM1_Qb;
    auVar40._0_8_ = extraout_XMM1_Qa;
    bVar3 = piVar19[2];
    uVar22 = (uint)(char)bVar3;
    if ((int)uVar22 < 0) {
      auVar31 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
      auVar31 = pshuflw(auVar31,auVar31,0);
      auVar34._0_4_ = auVar31._0_4_;
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      lVar23 = 0;
      do {
        auVar31 = paddsw(*(undefined1 (*) [16])((long)puVar27 + lVar23),auVar34);
        auVar40 = psraw(auVar31,ZEXT416(-uVar22));
        *(undefined1 (*) [16])((long)puVar27 + lVar23) = auVar40;
        lVar23 = lVar23 + 0x10;
      } while (lVar23 != 0x100);
    }
    else if (bVar3 != 0) {
      lVar23 = 0;
      do {
        auVar40 = ZEXT416(uVar22);
        auVar31 = psllw(*(undefined1 (*) [16])((long)puVar27 + lVar23),auVar40);
        *(undefined1 (*) [16])((long)puVar27 + lVar23) = auVar31;
        lVar23 = lVar23 + 0x10;
      } while (lVar23 != 0x100);
    }
    lVar23 = 0;
    do {
      psVar1 = (short *)((long)puVar27 + lVar23);
      sVar5 = psVar1[4];
      sVar6 = psVar1[5];
      sVar7 = psVar1[6];
      sVar8 = psVar1[7];
      auVar43._0_12_ = auVar40._0_12_;
      auVar43._12_2_ = auVar40._6_2_;
      auVar43._14_2_ = psVar1[3];
      auVar42._12_4_ = auVar43._12_4_;
      auVar42._0_10_ = auVar40._0_10_;
      auVar42._10_2_ = psVar1[2];
      auVar41._10_6_ = auVar42._10_6_;
      auVar41._0_8_ = auVar40._0_8_;
      auVar41._8_2_ = auVar40._4_2_;
      auVar18._4_8_ = auVar41._8_8_;
      auVar18._2_2_ = psVar1[1];
      auVar18._0_2_ = auVar40._2_2_;
      auVar40._0_4_ = (int)*psVar1;
      auVar40._4_4_ = auVar18._0_4_ >> 0x10;
      auVar40._8_4_ = auVar41._8_4_ >> 0x10;
      auVar40._12_4_ = auVar42._12_4_ >> 0x10;
      *(undefined1 (*) [16])(output + lVar25 * 8 + lVar23) = auVar40;
      piVar2 = output + lVar25 * 8 + lVar23 + 4;
      *piVar2 = (int)sVar5;
      piVar2[1] = (int)sVar6;
      piVar2[2] = (int)sVar7;
      piVar2[3] = (int)sVar8;
      lVar23 = lVar23 + 0x10;
    } while (lVar23 != 0x100);
    lVar25 = 1;
    bVar20 = false;
  } while (bVar24);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_16x16_sse2(const int16_t *input, int32_t *output,
                                     int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X16];
  const int txw_idx = get_txw_idx(TX_16X16);
  const int txh_idx = get_txh_idx(TX_16X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 16;
  const transform_1d_sse2 col_txfm = col_txfm8x16_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x16_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
    } else {
      load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    }
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    transpose_16bit_8x8(buf0, buf1 + 0 * width + 8 * i);
    transpose_16bit_8x8(buf0 + 8, buf1 + 1 * width + 8 * i);
  }

  for (int i = 0; i < 2; i++) {
    __m128i *buf;
    if (lr_flip) {
      buf = buf0;
      flip_buf_sse2(buf1 + width * i, buf, width);
    } else {
      buf = buf1 + width * i;
    }
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
  }
}